

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O1

string * __thiscall
cfd::api::json::ElementsDecodeLockingScript::GetPegout_hexString_abi_cxx11_
          (string *__return_storage_ptr__,ElementsDecodeLockingScript *this,
          ElementsDecodeLockingScript *obj)

{
  pointer pcVar1;
  UniValue json_value;
  string local_90;
  UniValue local_70;
  
  pcVar1 = (this->pegout_hex_)._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (this->pegout_hex_)._M_string_length);
  UniValue::UniValue(&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  UniValue::write_abi_cxx11_((UniValue *)__return_storage_ptr__,(int)&local_70,(void *)0x0,0);
  UniValue::~UniValue(&local_70);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetPegout_hexString(  // line separate
      const ElementsDecodeLockingScript& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.pegout_hex_);
  }